

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecondaryOperationalData.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::SecondaryOperationalData::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,SecondaryOperationalData *this)

{
  ostream *poVar1;
  KStringStream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  poVar1 = std::operator<<(local_188,"SecondaryOperationalData:");
  poVar1 = std::operator<<(poVar1,"\n\tParameter 1:                   ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8Param1);
  poVar1 = std::operator<<(poVar1,"\n\tParameter 2:                   ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8Param2);
  poVar1 = std::operator<<(poVar1,"\n\tNumber Fundamental Param Sets: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16NumFundParamSets);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

KString SecondaryOperationalData::GetAsString() const
{
    KStringStream ss;

    ss << "SecondaryOperationalData:"
       << "\n\tParameter 1:                   " << ( KUINT16 )m_ui8Param1
       << "\n\tParameter 2:                   " << ( KUINT16 )m_ui8Param2
       << "\n\tNumber Fundamental Param Sets: " << m_ui16NumFundParamSets
       << "\n";

    return ss.str();
}